

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O3

bool __thiscall QPicture::load(QPicture *this,QIODevice *dev)

{
  long lVar1;
  QPicturePrivate *pQVar2;
  bool bVar3;
  QExplicitlySharedDataPointer<QPicturePrivate> *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d_ptr).d.ptr;
  this_00 = &this->d_ptr;
  if ((pQVar2 != (QPicturePrivate *)0x0) &&
     ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i != 1)) {
    QExplicitlySharedDataPointer<QPicturePrivate>::detach_helper(this_00);
  }
  QIODevice::readAll();
  QBuffer::setData((QByteArray *)&((this_00->d).ptr)->pictb);
  bVar3 = QPicturePrivate::checkFormat((this_00->d).ptr);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,1,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QPicture::load(QIODevice *dev)
{
    detach();
    QByteArray a = dev->readAll();

    d_func()->pictb.setData(a);                        // set byte array in buffer
    return d_func()->checkFormat();
}